

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Pgno finalDbSize(BtShared *pBt,Pgno nOrig,Pgno nFree)

{
  uint uVar1;
  Pgno PVar2;
  bool bVar3;
  Pgno local_24;
  Pgno nFin;
  Pgno nPtrmap;
  int nEntry;
  Pgno nFree_local;
  Pgno nOrig_local;
  BtShared *pBt_local;
  
  uVar1 = pBt->usableSize / 5;
  PVar2 = ptrmapPageno(pBt,nOrig);
  local_24 = (nOrig - nFree) - ((nFree - nOrig) + PVar2 + uVar1) / uVar1;
  if (((uint)sqlite3PendingByte / pBt->pageSize + 1 < nOrig) &&
     (local_24 < (uint)sqlite3PendingByte / pBt->pageSize + 1)) {
    local_24 = local_24 - 1;
  }
  while( true ) {
    PVar2 = ptrmapPageno(pBt,local_24);
    bVar3 = true;
    if (PVar2 != local_24) {
      bVar3 = local_24 == (uint)sqlite3PendingByte / pBt->pageSize + 1;
    }
    if (!bVar3) break;
    local_24 = local_24 - 1;
  }
  return local_24;
}

Assistant:

static Pgno finalDbSize(BtShared *pBt, Pgno nOrig, Pgno nFree){
  int nEntry;                     /* Number of entries on one ptrmap page */
  Pgno nPtrmap;                   /* Number of PtrMap pages to be freed */
  Pgno nFin;                      /* Return value */

  nEntry = pBt->usableSize/5;
  nPtrmap = (nFree-nOrig+PTRMAP_PAGENO(pBt, nOrig)+nEntry)/nEntry;
  nFin = nOrig - nFree - nPtrmap;
  if( nOrig>PENDING_BYTE_PAGE(pBt) && nFin<PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }
  while( PTRMAP_ISPAGE(pBt, nFin) || nFin==PENDING_BYTE_PAGE(pBt) ){
    nFin--;
  }

  return nFin;
}